

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O2

address_type * __thiscall
cppcms::forwarder::check_forwading_rules
          (address_type *__return_storage_ptr__,forwarder *this,string *h,string *s,string *p)

{
  string sVar1;
  _Rb_tree_node_base *p_Var2;
  shared_lock<booster::shared_mutex> lock;
  shared_lock<booster::shared_mutex> local_60;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  undefined1 local_48 [24];
  
  local_60.m_ = &this->mutex_;
  booster::shared_mutex::shared_lock();
  p_Var2 = (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->rules_)._M_t._M_impl.super__Rb_tree_header) {
      local_58 = (undefined1  [8])local_48;
      (__return_storage_ptr__->first)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->first).field_2;
      (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 1) = local_48._1_8_;
      *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 9) = local_48._9_4_;
      *(undefined2 *)((long)&(__return_storage_ptr__->first).field_2 + 0xd) = local_48._13_2_;
      (__return_storage_ptr__->first).field_2._M_local_buf[0xf] = local_48[0xf];
      (__return_storage_ptr__->first)._M_string_length = 0;
      local_50._M_p = (pointer)0x0;
      local_48[0] = 0;
      __return_storage_ptr__->second = 0;
      std::__cxx11::string::~string((string *)local_58);
LAB_002342e4:
      booster::shared_lock<booster::shared_mutex>::~shared_lock(&local_60);
      return __return_storage_ptr__;
    }
    mount_point::match((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_58,*(mount_point **)(p_Var2 + 1),h,s,p);
    sVar1 = local_58[0];
    std::__cxx11::string::~string((string *)&local_50);
    if (sVar1 == (string)0x1) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      pair(__return_storage_ptr__,
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            *)&p_Var2[1]._M_left);
      goto LAB_002342e4;
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

forwarder::address_type forwarder::check_forwading_rules(std::string const &h,std::string const &s,std::string const &p)
	{
		booster::shared_lock<booster::shared_mutex> lock(mutex_);
		for(rules_type::const_iterator it=rules_.begin();it!=rules_.end();++it) {
			if(it->first->match(h,s,p).first)
				return it->second;
		}
		return address_type(std::string(),0);
	}